

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecSqrtAbs(axbVec_s *x)

{
  _func_axbStatus_t_axbVec_s_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  axbVec_s *x_local;
  
  op_desc._48_8_ = x;
  if (x->init == 0x1d232) {
    memcpy(&op,x->opBackend->op_table + 1,0x38);
    (*op)((axbVec_s *)op_desc._48_8_,op_desc.func);
    x_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    x_local._4_4_ = 0x1d232;
  }
  return x_local._4_4_;
}

Assistant:

axbStatus_t axbVecSqrtAbs(struct axbVec_s *x)
{
  AXB_VECTOR_INIT_CHECK(x);

  axbOpDescriptor_t op_desc = x->opBackend->op_table[AXB_OP_VEC_SQRTABS];
  axbStatus_t (*op)(struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, void*)) op_desc.func;
  op(x, op_desc.func_data);
  return 0;
}